

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O2

void __thiscall OpenMD::Equipartition::doFrame(Equipartition *this,int param_1)

{
  SelectionManager *this_00;
  undefined1 auVar1 [16];
  Equipartition *pEVar2;
  StuntDouble *this_01;
  int extraout_EDX;
  int __denom;
  int extraout_EDX_00;
  int __denom_00;
  int __numer;
  int *i_00;
  int iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int i;
  Vector3d angMom_Temp;
  Vector3d linMom_Temp;
  Vector3d angMom;
  Vector3d linMom;
  Mat3x3d momentInertia;
  int local_10c;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_e8;
  double local_c8;
  Equipartition *local_c0;
  Vector<double,_3U> local_b8;
  Vector<double,_3U> local_98;
  SelectionSet local_78;
  double local_58;
  double local_38;
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_78,&(this->super_SequentialAnalyzer).evaluator1_);
    SelectionManager::setSelectionSet(&(this->super_SequentialAnalyzer).seleMan1_,&local_78);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_78.bitsets_);
  }
  Vector<double,_3U>::Vector(&local_e8);
  Vector<double,_3U>::Vector(&local_108);
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  i_00 = &local_10c;
  local_c0 = this;
  this_01 = SelectionManager::beginSelected(this_00,i_00);
  iVar3 = 0;
  __denom = extraout_EDX;
  while (__numer = (int)i_00, this_01 != (StuntDouble *)0x0) {
    StuntDouble::getVel((Vector3d *)&local_b8,this_01);
    operator*((Vector<double,_3U> *)&local_78,&local_b8,this_01->mass_);
    Vector<double,_3U>::Vector(&local_98,(Vector<double,_3U> *)&local_78);
    dVar4 = this_01->mass_ * 8.31451e-07;
    auVar5._0_8_ = local_98.data_[0] * local_98.data_[0];
    auVar5._8_8_ = local_98.data_[1] * local_98.data_[1];
    auVar6._8_8_ = dVar4;
    auVar6._0_8_ = dVar4;
    auVar6 = divpd(auVar5,auVar6);
    local_e8.data_[0] = auVar6._0_8_ + local_e8.data_[0];
    local_e8.data_[1] = auVar6._8_8_ + local_e8.data_[1];
    local_e8.data_[2] = (local_98.data_[2] * local_98.data_[2]) / dVar4 + local_e8.data_[2];
    if (this_01->objType_ - otDAtom < 2) {
      StuntDouble::getJ((Vector3d *)&local_b8,this_01);
      (*this_01->_vptr_StuntDouble[5])(&local_78,this_01);
      auVar7._0_8_ = local_b8.data_[0] * local_b8.data_[0];
      auVar7._8_8_ = local_b8.data_[1] * local_b8.data_[1];
      auVar1._8_8_ = local_58 * 8.31451e-07;
      auVar1._0_8_ = (double)local_78.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start * 8.31451e-07;
      auVar6 = divpd(auVar7,auVar1);
      local_108.data_[0] = auVar6._0_8_ + local_108.data_[0];
      local_108.data_[1] = auVar6._8_8_ + local_108.data_[1];
      local_108.data_[2] =
           (local_b8.data_[2] * local_b8.data_[2]) / (local_38 * 8.31451e-07) + local_108.data_[2];
    }
    i_00 = &local_10c;
    this_01 = SelectionManager::nextSelected(this_00,i_00);
    iVar3 = iVar3 + 1;
    __denom = extraout_EDX_00;
  }
  local_c8 = (double)iVar3;
  Vector<double,_3U>::div(&local_e8,__numer,__denom);
  Vector<double,_3U>::div(&local_108,__numer,__denom_00);
  pEVar2 = local_c0;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&local_c0->TempP_,(value_type *)&local_e8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&pEVar2->TempJ_,(value_type *)&local_108);
  return;
}

Assistant:

void Equipartition::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    const RealType kb = 8.31451e-7;
    Vector3d linMom_Temp;
    Vector3d angMom_Temp;
    int count = 0;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      count++;
      Vector3d linMom = sd->getVel() * sd->getMass();
      linMom_Temp[0] += linMom[0] * linMom[0] / (kb * sd->getMass());
      linMom_Temp[1] += linMom[1] * linMom[1] / (kb * sd->getMass());
      linMom_Temp[2] += linMom[2] * linMom[2] / (kb * sd->getMass());
      if (sd->isDirectional()) {
        Vector3d angMom       = sd->getJ();
        Mat3x3d momentInertia = sd->getI();
        angMom_Temp[0] += angMom[0] * angMom[0] / (kb * momentInertia(0, 0));
        angMom_Temp[1] += angMom[1] * angMom[1] / (kb * momentInertia(1, 1));
        angMom_Temp[2] += angMom[2] * angMom[2] / (kb * momentInertia(2, 2));
      }
    }

    linMom_Temp /= count;
    angMom_Temp /= count;
    TempP_.push_back(linMom_Temp);
    TempJ_.push_back(angMom_Temp);
  }